

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniFB_cpp.cpp
# Opt level: O2

void mfb_stub::char_input_stub(mfb_window *window,uint code)

{
  mfb_stub *pmVar1;
  
  pmVar1 = GetInstance(window);
  std::function<void_(mfb_window_*,_unsigned_int)>::operator()(&pmVar1->m_char_input,window,code);
  return;
}

Assistant:

void 
mfb_stub::char_input_stub(struct mfb_window *window, unsigned int code) {
    mfb_stub    *stub = mfb_stub::GetInstance(window);
    stub->m_char_input(window, code);
}